

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_merge_distr_patch
               (Integer g_a,Integer *alo,Integer *ahi,Integer g_b,Integer *blo,Integer *bhi)

{
  short sVar1;
  short sVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  Integer IVar6;
  global_array_t *pgVar7;
  long lVar8;
  undefined8 *alpha;
  long lVar9;
  long lVar10;
  bool bVar11;
  double d_one;
  void *src_data_ptr;
  Integer mlo [7];
  Integer mhi [7];
  Integer mld [7];
  Integer dhi [7];
  Integer dlo [7];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  long local_198;
  long local_190;
  void *local_188;
  long local_180;
  long local_178;
  Integer local_170;
  Integer local_168 [8];
  Integer local_128 [8];
  Integer local_e8 [8];
  Integer local_a8 [8];
  Integer local_68 [7];
  
  iVar5 = _ga_sync_end;
  bVar11 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar11) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"nga_merge_distr_patch");
  pnga_check_handle(g_b,"nga_merge_distr_patch");
  local_190 = g_a * 0x368;
  if (((long)GA[g_a + 1000].p_handle < 0) || (PGRP_LIST[GA[g_a + 1000].p_handle].mirrored == 0)) {
    IVar6 = pnga_cluster_nnodes();
    if (IVar6 < 2) {
      local_168[0]._0_2_ = 0x4e;
      pnga_copy_patch((char *)local_168,g_a,alo,ahi,g_b,blo,bhi);
      return;
    }
    pnga_error("Handle to a non-mirrored array passed",0);
  }
  lVar10 = g_a + 1000;
  local_198 = g_b * 0x368;
  local_170 = g_b;
  if (((-1 < (long)GA[g_b + 1000].p_handle) && (PGRP_LIST[GA[g_b + 1000].p_handle].mirrored != 0))
     && (IVar6 = pnga_cluster_nnodes(), IVar6 != 0)) {
    pnga_error("Distributed array is mirrored",0);
  }
  sVar1 = GA[lVar10].ndim;
  lVar9 = (long)sVar1;
  sVar2 = GA[g_b + 1000].ndim;
  local_178 = (long)GA[lVar10].p_handle;
  if (sVar1 != sVar2) {
    pnga_error("Global arrays must have same dimension",0);
  }
  local_180 = (long)GA[lVar10].type;
  if (GA[lVar10].type != GA[g_b + 1000].type) {
    pnga_error("Global arrays must be of same type",0);
  }
  if (0 < sVar1) {
    local_190 = local_190 + 0xd4e70;
    lVar10 = 0;
    pgVar7 = GA;
    do {
      lVar8 = alo[lVar10];
      if (((lVar8 < 0) ||
          (lVar3 = *(long *)((long)pgVar7->dims + lVar10 * 8 + local_190 + -0x30), lVar3 <= lVar8))
         || ((lVar4 = ahi[lVar10], lVar4 < lVar8 || ((lVar4 < 0 || (lVar3 <= lVar4)))))) {
        pnga_error("Invalid patch index on mirrored GA",0);
        pgVar7 = GA;
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  if (0 < sVar2) {
    local_198 = local_198 + 0xd4e70;
    lVar10 = 0;
    pgVar7 = GA;
    do {
      lVar8 = blo[lVar10];
      if ((((lVar8 < 0) ||
           (lVar3 = *(long *)((long)pgVar7->dims + lVar10 * 8 + local_198 + -0x30), lVar3 <= lVar8))
          || (lVar4 = bhi[lVar10], lVar4 < lVar8)) || ((lVar4 < 0 || (lVar3 <= lVar4)))) {
        pnga_error("Invalid patch index on distributed GA",0);
        pgVar7 = GA;
      }
      lVar10 = lVar10 + 1;
    } while (sVar2 != lVar10);
    if (0 < sVar2) {
      lVar10 = 0;
      do {
        if (ahi[lVar10] - alo[lVar10] != bhi[lVar10] - blo[lVar10]) {
          pnga_error("Patch dimensions do not match for index ",lVar10);
        }
        lVar10 = lVar10 + 1;
      } while (sVar2 != lVar10);
    }
  }
  IVar6 = local_170;
  pnga_zero_patch(local_170,blo,bhi);
  pnga_distribution(g_a,(long)PGRP_LIST[local_178].map_proc_list[GAme],local_168,local_128);
  if (sVar1 < 1) {
LAB_0016bf0d:
    pnga_access_ptr(g_a,local_168,local_128,&local_188,local_e8);
  }
  else {
    bVar11 = true;
    lVar10 = 0;
    do {
      if (local_128[lVar10] < alo[lVar10]) {
        bVar11 = false;
      }
      if (ahi[lVar10] < local_168[lVar10]) {
        bVar11 = false;
      }
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
    if (!bVar11) goto LAB_0016c00e;
    if (sVar1 < 1) goto LAB_0016bf0d;
    lVar10 = 0;
    do {
      lVar8 = local_168[lVar10];
      if (local_168[lVar10] < alo[lVar10]) {
        lVar8 = alo[lVar10];
      }
      local_168[lVar10] = lVar8;
      lVar8 = local_128[lVar10];
      if (ahi[lVar10] < local_128[lVar10]) {
        lVar8 = ahi[lVar10];
      }
      local_128[lVar10] = lVar8;
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
    pnga_access_ptr(g_a,local_168,local_128,&local_188,local_e8);
    if (0 < sVar1) {
      lVar10 = 0;
      do {
        lVar8 = blo[lVar10];
        lVar3 = alo[lVar10];
        local_68[lVar10] = (local_168[lVar10] + lVar8) - lVar3;
        local_a8[lVar10] = (lVar8 - lVar3) + local_128[lVar10];
        lVar10 = lVar10 + 1;
      } while (lVar9 != lVar10);
    }
  }
  switch((int)local_180) {
  case 0x3e9:
  case 0x3ea:
    alpha = &local_1a8;
    local_1a8 = 1;
    break;
  case 0x3eb:
    alpha = &local_1a8;
    local_1a8 = CONCAT44(local_1a8._4_4_,0x3f800000);
    break;
  case 0x3ec:
    alpha = &local_1a8;
    local_1a8 = 0x3ff0000000000000;
    break;
  default:
    pnga_error("Type not supported",local_180);
    alpha = (undefined8 *)0x0;
    break;
  case 0x3ee:
    alpha = &local_1a8;
    local_1a8 = 0x3f800000;
    break;
  case 0x3ef:
    alpha = &local_1a8;
    local_1a8 = 0x3ff0000000000000;
    uStack_1a0 = 0;
  }
  pnga_acc(IVar6,local_68,local_a8,local_188,local_e8,alpha);
LAB_0016c00e:
  if (iVar5 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_merge_distr_patch(Integer g_a, Integer *alo, Integer *ahi,
                            Integer g_b, Integer *blo, Integer *bhi)
/*    Integer g_a  handle to mirrored array
      Integer *alo  indices of lower corner of mirrored array patch
      Integer *ahi  indices of upper corner of mirrored array patch
      Integer g_b  handle to distributed array
      Integer *blo  indices of lower corner of distributed array patch
      Integer *bhi  indices of upper corner of distributed array patch
*/
{
  Integer local_sync_begin, local_sync_end;
  Integer a_handle, b_handle, adim, bdim;
  Integer mlo[MAXDIM], mhi[MAXDIM], mld[MAXDIM];
  Integer dlo[MAXDIM], dhi[MAXDIM];
  char trans[2];
  double d_one;
  Integer type, i_one;
  double z_one[2];
  float  c_one[2];
  float f_one;
  long l_one;
  void *src_data_ptr;
  void *one = NULL;
  Integer i, idim, intersect, p_handle;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end = 1; /*remove any previous masking */
  if (local_sync_begin) pnga_sync();
  pnga_check_handle(g_a, "nga_merge_distr_patch");
  pnga_check_handle(g_b, "nga_merge_distr_patch");

  /* check to make sure that both patches lie within global arrays and
     that patches are the same dimensions */
  a_handle = GA_OFFSET + g_a;
  b_handle = GA_OFFSET + g_b;

  if (!pnga_is_mirrored(g_a)) {
    if (pnga_cluster_nnodes() > 1) {
      pnga_error("Handle to a non-mirrored array passed",0);
    } else {
      trans[0] = 'N';
      trans[1] = '\0';
      pnga_copy_patch(trans, g_a, alo, ahi, g_b, blo, bhi);
      return;
    }
  }

  if (pnga_is_mirrored(g_b) && pnga_cluster_nnodes())
    pnga_error("Distributed array is mirrored",0);

  adim = GA[a_handle].ndim;
  bdim = GA[b_handle].ndim;

  p_handle = GA[a_handle].p_handle;

  if (adim != bdim)
    pnga_error("Global arrays must have same dimension",0);

  type = GA[a_handle].type;
  if (type != GA[b_handle].type)
    pnga_error("Global arrays must be of same type",0);

  for (i=0; i<adim; i++) {
    idim = (Integer)GA[a_handle].dims[i];
    if (alo[i] < 0 || alo[i] >= idim || ahi[i] < 0 || ahi[i] >= idim ||
        alo[i] > ahi[i])
      pnga_error("Invalid patch index on mirrored GA",0);
  }
  for (i=0; i<bdim; i++) {
    idim = GA[b_handle].dims[i];
    if (blo[i] < 0 || blo[i] >= idim || bhi[i] < 0 || bhi[i] >= idim ||
        blo[i] > bhi[i])
      pnga_error("Invalid patch index on distributed GA",0);
  }
  for (i=0; i<bdim; i++) {
    idim = (Integer)GA[b_handle].dims[i];
    if (ahi[i] - alo[i] != bhi[i] - blo[i])
      pnga_error("Patch dimensions do not match for index ",i);
  }
  pnga_zero_patch(g_b, blo, bhi);

  /* Find coordinates of mirrored array patch that I own */
  i = PGRP_LIST[p_handle].map_proc_list[GAme];
  pnga_distribution(g_a, i, mlo, mhi);
  /* Check to see if mirrored array patch intersects my portion of
     mirrored array */
  intersect = 1;
  for (i=0; i<adim; i++) {
    if (mhi[i] < alo[i]) intersect = 0;
    if (mlo[i] > ahi[i]) intersect = 0;
  }
  if (intersect) {
    /* get portion of mirrored array patch that actually resides on this
       processor */
    for (i=0; i<adim; i++) {
      mlo[i] = GA_MAX(alo[i],mlo[i]);
      mhi[i] = GA_MIN(ahi[i],mhi[i]);
    }

    /* get pointer to locally held distribution */
    pnga_access_ptr(g_a, mlo, mhi, &src_data_ptr, mld);

    /* find indices in distributed array corresponding to this patch */
    for (i=0; i<adim; i++) {
      dlo[i] = blo[i] + mlo[i]-alo[i];
      dhi[i] = blo[i] + mhi[i]-alo[i];
    }

    /* perform accumulate */
    if (type == C_DBL) {
      d_one = 1.0;
      one = &d_one;
    } else if (type == C_DCPL) {
      z_one[0] = 1.0;
      z_one[1] = 0.0;
      one = &z_one;
    } else if (type == C_SCPL) {
      c_one[0] = 1.0;
      c_one[1] = 0.0;
      one = &c_one;
    } else if (type == C_FLOAT) {
      f_one = 1.0;
      one = &f_one;
    } else if (type == C_INT) {
      i_one = 1;
      one = &i_one;
    } else if (type == C_LONG) {
      l_one = 1;
      one = &l_one;
    } else {
      pnga_error("Type not supported",type);
    }
    pnga_acc(g_b, dlo, dhi, src_data_ptr, mld, one);
  }
  if (local_sync_end) pnga_sync();
}